

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.test.cpp
# Opt level: O1

string * chunkMF1_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.001000+3 9.991673-1          0          0          0          3 125 1451     \n 0.000000+0 0.000000+0          0          0          0          6 125 1451     \n 1.000000+0 2.000000+7          0          0         10          8 125 1451     \n 0.000000+0 0.000000+0          0          0          8          5 125 1451     \n  1-H -  1 LANL       EVAL-OCT05 G.M.Hale                          125 1451     \n                      DIST-DEC06                       20111222    125 1451     \n----ENDF/B-VIII.beta  MATERIAL  125                                125 1451     \n-----INCIDENT NEUTRON DATA                                         125 1451     \n------ENDF-6 FORMAT                                                125 1451     \n                                                                   125 1451     \n ****************************************************************  125 1451     \n ****************************************************************  125 1451     \n                                1        451         17          5 125 1451     \n                                2        151          4          0 125 1451     \n                                3          1          4          4 125 1451     \n                                3          5          4          4 125 1451     \n                                4          5          4          4 125 1451     \n                                                                   125 1  0     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkMF1() {

  // this is a legal MF1
  return
    " 1.001000+3 9.991673-1          0          0          0          3 125 1451     \n"
    " 0.000000+0 0.000000+0          0          0          0          6 125 1451     \n"
    " 1.000000+0 2.000000+7          0          0         10          8 125 1451     \n"
    " 0.000000+0 0.000000+0          0          0          8          5 125 1451     \n"
    "  1-H -  1 LANL       EVAL-OCT05 G.M.Hale                          125 1451     \n"
    "                      DIST-DEC06                       20111222    125 1451     \n"
    "----ENDF/B-VIII.beta  MATERIAL  125                                125 1451     \n"
    "-----INCIDENT NEUTRON DATA                                         125 1451     \n"
    "------ENDF-6 FORMAT                                                125 1451     \n"
    "                                                                   125 1451     \n"
    " ****************************************************************  125 1451     \n"
    " ****************************************************************  125 1451     \n"
    "                                1        451         17          5 125 1451     \n"
    "                                2        151          4          0 125 1451     \n"
    "                                3          1          4          4 125 1451     \n"
    "                                3          5          4          4 125 1451     \n"
    "                                4          5          4          4 125 1451     \n"
    "                                                                   125 1  0     \n";
}